

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender __thiscall
fmt::v9::detail::write_int_localized<fmt::v9::appender,unsigned__int128,char>
          (detail *this,appender out,unsigned___int128 value,uint prefix,
          basic_format_specs<char> *specs,digit_grouping<char> *grouping)

{
  byte bVar1;
  undefined1 n [16];
  undefined1 value_00 [16];
  int iVar2;
  appender aVar3;
  byte *pbVar4;
  uint uVar5;
  byte *pbVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  undefined8 *in_R9;
  char digits [40];
  undefined8 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  anon_class_32_4_dca7119b local_78;
  detail local_58 [40];
  
  iVar7 = (int)specs;
  n._8_4_ = in_stack_ffffffffffffff80;
  n._0_8_ = in_stack_ffffffffffffff78;
  n._12_4_ = iVar7;
  iVar2 = count_digits_fallback<unsigned__int128>
                    ((detail *)
                     out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,
                     (unsigned___int128)n);
  value_00._8_4_ = iVar2;
  value_00._0_8_ = in_stack_ffffffffffffff78;
  value_00._12_4_ = iVar7;
  format_decimal<char,unsigned__int128>
            (local_58,(char *)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                              container,(unsigned___int128)value_00,prefix);
  pbVar4 = (byte *)*in_R9;
  pbVar6 = pbVar4 + in_R9[1];
  uVar5 = iVar2 - (uint)(iVar7 == 0);
  iVar7 = 0;
  do {
    iVar9 = 0x7fffffff;
    if (*(char *)(in_R9 + 4) != '\0') {
      if (pbVar4 == pbVar6) {
        uVar8 = (uint)(char)pbVar6[-1];
      }
      else {
        bVar1 = *pbVar4;
        if ((byte)(bVar1 + 0x81) < 0x82) goto LAB_001400c2;
        pbVar4 = pbVar4 + 1;
        uVar8 = (uint)bVar1;
      }
      iVar7 = iVar7 + uVar8;
      iVar9 = iVar7;
    }
LAB_001400c2:
    uVar5 = uVar5 + 1;
    if (iVar2 <= iVar9) {
      if (-1 < (int)uVar5) {
        local_78.prefix = (uint *)&stack0xffffffffffffff84;
        local_78.num_digits = (int *)&stack0xffffffffffffff80;
        local_78.digits = (char (*) [40])local_58;
        aVar3 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int_localized<fmt::v9::appender,unsigned__int128,char>(fmt::v9::appender,unsigned__int128,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::digit_grouping<char>const&)::_lambda(fmt::v9::appender)_1_>
                          ((appender)this,(basic_format_specs<char> *)grouping,(ulong)uVar5,
                           (ulong)uVar5,&local_78);
        return (appender)aVar3.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
      }
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
                  ,0x199,"negative value");
    }
  } while( true );
}

Assistant:

auto write_int_localized(OutputIt out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs,
                         const digit_grouping<Char>& grouping) -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = count_digits(value);
  char digits[40];
  format_decimal(digits, value, num_digits);
  unsigned size = to_unsigned((prefix != 0 ? 1 : 0) + num_digits +
                              grouping.count_separators(num_digits));
  return write_padded<align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        if (prefix != 0) {
          char sign = static_cast<char>(prefix);
          *it++ = static_cast<Char>(sign);
        }
        return grouping.apply(it, string_view(digits, to_unsigned(num_digits)));
      });
}